

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D56TexOffset::emulate_mthd(MthdEmuD3D56TexOffset *this)

{
  sbyte sVar1;
  sbyte sVar2;
  int local_14;
  int j;
  MthdEmuD3D56TexOffset *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    if ((this->which & 1 << ((byte)local_14 & 0x1f)) != 0) {
      if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                     << 0x3e)) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_offset[local_14]
             = (this->super_SingleMthdTest).super_MthdTest.val;
        pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                            local_14,(this->super_SingleMthdTest).super_MthdTest.val,true);
      }
      sVar1 = 0xe;
      if (local_14 != 0) {
        sVar1 = 0x16;
      }
      sVar2 = 0xe;
      if (local_14 != 0) {
        sVar2 = 0x16;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] &
           ((uint)(1L << sVar1) ^ 0xffffffff) | (uint)(1L << sVar2);
    }
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
       chipset.chipset != 0x10) && (this->which == 3)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[0] = 4;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		for (int j = 0; j < 2; j++) {
			if (which & (1 << j)) {
				if (!extr(exp.nsource, 1, 1)) {
					exp.bundle_tex_offset[j] = val;
					pgraph_celsius_icmd(&exp, j, val, true);
				}
				insrt(exp.valid[1], j ? 22 : 14, 1, 1);
			}
		}
		if (chipset.chipset != 0x10 && which == 3) {
			exp.celsius_pipe_junk[0] = 4;
		}
	}